

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_proxy_module.c
# Opt level: O3

void ngx_stream_proxy_process(ngx_stream_session_t *s,ngx_uint_t from_upstream,ngx_uint_t do_write)

{
  undefined1 *puVar1;
  uint uVar2;
  ngx_connection_t *pnVar3;
  ngx_stream_upstream_t *pnVar4;
  void *pvVar5;
  ulong uVar6;
  ngx_stream_upstream_state_t *pnVar7;
  u_char *puVar8;
  ngx_buf_t *pnVar9;
  ngx_log_handler_pt p_Var10;
  ngx_event_t *pnVar11;
  bool bVar12;
  ngx_chain_t **ppnVar13;
  ulong *puVar14;
  ngx_int_t nVar15;
  ssize_t sVar16;
  ngx_chain_t **ppnVar17;
  ngx_chain_t *pnVar18;
  size_t sVar19;
  ngx_connection_t *pnVar20;
  ngx_connection_t *pnVar21;
  ngx_uint_t nVar22;
  ngx_log_t *pnVar23;
  size_t sVar24;
  char *pcVar25;
  char *pcVar26;
  long lVar27;
  ngx_chain_t **busy;
  long lVar28;
  ngx_chain_t **out;
  off_t oVar29;
  off_t *local_70;
  ngx_buf_t *local_58;
  ngx_connection_t *local_40;
  
  pnVar3 = s->connection;
  pnVar4 = s->upstream;
  if ((pnVar4->field_0x178 & 1) == 0) {
    pnVar20 = (ngx_connection_t *)0x0;
  }
  else {
    pnVar20 = (pnVar4->peer).connection;
  }
  if ((pnVar3->type != 2) || ((ngx_terminate == 0 && (ngx_exiting == 0)))) {
    pvVar5 = s->srv_conf[ngx_stream_proxy_module.ctx_index];
    if (from_upstream == 0) {
      local_58 = &pnVar4->downstream_buf;
      puVar14 = (ulong *)((long)pvVar5 + 0x20);
      local_70 = &s->received;
      lVar27 = 0x120;
      lVar28 = 0x118;
      pnVar21 = pnVar20;
      local_40 = pnVar3;
    }
    else {
      local_58 = &pnVar4->upstream_buf;
      puVar14 = (ulong *)((long)pvVar5 + 0x28);
      local_70 = &pnVar4->received;
      lVar27 = 0x130;
      lVar28 = 0x128;
      pnVar21 = pnVar3;
      local_40 = pnVar20;
    }
    out = (ngx_chain_t **)((long)&(pnVar4->peer).connection + lVar28);
    busy = (ngx_chain_t **)((long)&(pnVar4->peer).connection + lVar27);
    uVar6 = *puVar14;
    bVar12 = do_write != 0 && pnVar21 != (ngx_connection_t *)0x0;
    do {
      if ((bVar12) &&
         (((*out != (ngx_chain_t *)0x0 || (*busy != (ngx_chain_t *)0x0)) ||
          (pnVar21->field_0xd8 != '\0')))) {
        nVar15 = (*ngx_stream_top_filter)(s,*out,from_upstream);
        if (nVar15 == -1) {
          if ((from_upstream == 0) && (pnVar3->type == 2)) goto LAB_0018f5c9;
          nVar22 = 200;
          goto LAB_0018f61b;
        }
        ngx_chain_update_chains(pnVar3->pool,&pnVar4->free,busy,out,&ngx_stream_proxy_module);
        if (*busy == (ngx_chain_t *)0x0) {
          local_58->pos = local_58->start;
          local_58->last = local_58->start;
        }
      }
      sVar19 = (long)local_58->end - (long)local_58->last;
      if (sVar19 == 0) {
LAB_0018f416:
        uVar2 = *(uint *)&local_40->read->field_0x8;
        if ((((uVar2 >> 8 & 1) == 0) || (pnVar21 == (ngx_connection_t *)0x0)) ||
           (((pnVar21->read->field_0x9 & 1) == 0 && (pnVar21->field_0xd8 != '\0')))) {
          if (((local_40->field_0xda & 2) != 0) ||
             (nVar15 = ngx_handle_read_event(local_40->read,(ulong)(uVar2 >> 8 & 1)), nVar15 == 0))
          {
            if (pnVar21 == (ngx_connection_t *)0x0) {
              return;
            }
            if (((pnVar21->field_0xda & 2) != 0) ||
               (nVar15 = ngx_handle_write_event(pnVar21->write,0), nVar15 == 0)) {
              if (((pnVar3->read->field_0x9 & 0x10) == 0) &&
                 ((pnVar20->read->field_0x9 & 0x10) == 0)) {
                ngx_event_add_timer(pnVar3->write,*(ngx_msec_t *)((long)pvVar5 + 8));
                return;
              }
              pnVar11 = pnVar3->write;
              if ((pnVar11->field_0x9 & 8) == 0) {
                return;
              }
              if ((pnVar11->log->log_level & 0x80) != 0) {
                ngx_log_error_core(8,pnVar11->log,0,"event timer del: %d: %M",
                                   (ulong)*(uint *)((long)pnVar11->data + 0x18),(pnVar11->timer).key
                                  );
              }
              ngx_rbtree_delete(&ngx_event_timer_rbtree,&pnVar11->timer);
              (pnVar11->timer).left = (ngx_rbtree_node_t *)0x0;
              (pnVar11->timer).right = (ngx_rbtree_node_t *)0x0;
              (pnVar11->timer).parent = (ngx_rbtree_node_t *)0x0;
              pnVar11->field_0x9 = pnVar11->field_0x9 & 0xf7;
              return;
            }
          }
          nVar22 = 500;
        }
        else {
          pnVar23 = pnVar3->log;
          p_Var10 = pnVar23->handler;
          pnVar23->handler = (ngx_log_handler_pt)0x0;
          if (6 < pnVar23->log_level) {
            pcVar25 = "";
            if (local_40->type == 2) {
              pcVar25 = "udp ";
            }
            pcVar26 = "client";
            if (from_upstream != 0) {
              pcVar26 = "upstream";
            }
            if (pnVar20 == (ngx_connection_t *)0x0) {
              oVar29 = 0;
            }
            else {
              oVar29 = pnVar20->sent;
            }
            ngx_log_error_core(7,pnVar23,0,
                               "%s%s disconnected, bytes from/to client:%O/%O, bytes from/to upstream:%O/%O"
                               ,pcVar25,pcVar26,s->received,pnVar3->sent,pnVar4->received,oVar29);
            pnVar23 = pnVar3->log;
          }
          pnVar23->handler = p_Var10;
          nVar22 = 200;
        }
        goto LAB_0018f61b;
      }
      uVar2 = *(uint *)&local_40->read->field_0x8;
      if ((uVar2 & 0x1220) != 0x20) goto LAB_0018f416;
      if (uVar6 != 0) {
        lVar27 = ((ngx_cached_time->sec - pnVar4->start_sec) + 1) * uVar6;
        sVar24 = lVar27 - *local_70;
        if (sVar24 == 0 || lVar27 < *local_70) {
          *(uint *)&local_40->read->field_0x8 = uVar2 | 0x1000;
          ngx_event_add_timer(local_40->read,(sVar24 * -1000) / uVar6 + 1);
          goto LAB_0018f416;
        }
        if ((long)sVar24 <= (long)sVar19) {
          sVar19 = sVar24;
        }
      }
      sVar16 = (*local_40->recv)(local_40,local_58->last,sVar19);
      if (sVar16 == -1) {
        if ((pnVar3->type == 2) && (pnVar4->received == 0)) {
LAB_0018f5c9:
          ngx_stream_proxy_next_upstream(s);
          return;
        }
        puVar1 = &local_40->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
        sVar16 = 0;
      }
      else if ((sVar16 == -2) || (sVar16 < 0)) goto LAB_0018f416;
      if ((uVar6 != 0) && (uVar6 <= (ulong)(sVar16 * 1000))) {
        puVar1 = &local_40->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x1000;
        ngx_event_add_timer(local_40->read,(ulong)(sVar16 * 1000) / uVar6);
      }
      if ((from_upstream != 0) &&
         (pnVar7 = pnVar4->state, pnVar7->first_byte_time == 0xffffffffffffffff)) {
        pnVar7->first_byte_time = ngx_current_msec - pnVar7->response_time;
      }
      ppnVar13 = out;
      if ((pnVar3->type == 2) &&
         (nVar22 = pnVar4->responses + 1, pnVar4->responses = nVar22,
         nVar22 == *(ngx_uint_t *)((long)pvVar5 + 0x30))) {
        puVar1 = &local_40->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffffffdf;
        puVar1 = &local_40->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
      }
      do {
        ppnVar17 = ppnVar13;
        pnVar18 = *ppnVar17;
        ppnVar13 = &pnVar18->next;
      } while (pnVar18 != (ngx_chain_t *)0x0);
      pnVar18 = ngx_chain_get_free_buf(pnVar3->pool,&pnVar4->free);
      if (pnVar18 == (ngx_chain_t *)0x0) goto LAB_0018f3e6;
      *ppnVar17 = pnVar18;
      puVar8 = local_58->last;
      pnVar9 = pnVar18->buf;
      pnVar9->pos = puVar8;
      pnVar9->last = puVar8 + sVar16;
      pnVar9->tag = &ngx_stream_proxy_module;
      *(ushort *)&pnVar9->field_0x48 =
           (ushort)*(undefined4 *)&pnVar9->field_0x48 & 0xfffe | (ushort)(sVar16 != 0);
      *(ushort *)&pnVar18->buf->field_0x48 =
           (ushort)*(undefined4 *)&pnVar18->buf->field_0x48 & 0xff7f |
           *(ushort *)&local_40->read->field_0x8 >> 1 & 0x80;
      puVar1 = &pnVar18->buf->field_0x48;
      *(ushort *)puVar1 = *(ushort *)puVar1 | 0x20;
      *local_70 = *local_70 + sVar16;
      local_58->last = local_58->last + sVar16;
      bVar12 = pnVar21 != (ngx_connection_t *)0x0;
    } while( true );
  }
  pnVar23 = pnVar3->log;
  p_Var10 = pnVar23->handler;
  pnVar23->handler = (ngx_log_handler_pt)0x0;
  if (6 < pnVar23->log_level) {
    ngx_log_error_core(7,pnVar23,0,"disconnected on shutdown");
    pnVar23 = pnVar3->log;
  }
  pnVar23->handler = p_Var10;
  nVar22 = 200;
LAB_0018f61b:
  ngx_stream_proxy_finalize(s,nVar22);
  return;
LAB_0018f3e6:
  nVar22 = 500;
  goto LAB_0018f61b;
}

Assistant:

static void
ngx_stream_proxy_process(ngx_stream_session_t *s, ngx_uint_t from_upstream,
    ngx_uint_t do_write)
{
    off_t                        *received, limit;
    size_t                        size, limit_rate;
    ssize_t                       n;
    ngx_buf_t                    *b;
    ngx_int_t                     rc;
    ngx_uint_t                    flags;
    ngx_msec_t                    delay;
    ngx_chain_t                  *cl, **ll, **out, **busy;
    ngx_connection_t             *c, *pc, *src, *dst;
    ngx_log_handler_pt            handler;
    ngx_stream_upstream_t        *u;
    ngx_stream_proxy_srv_conf_t  *pscf;

    u = s->upstream;

    c = s->connection;
    pc = u->connected ? u->peer.connection : NULL;

    if (c->type == SOCK_DGRAM && (ngx_terminate || ngx_exiting)) {

        /* socket is already closed on worker shutdown */

        handler = c->log->handler;
        c->log->handler = NULL;

        ngx_log_error(NGX_LOG_INFO, c->log, 0, "disconnected on shutdown");

        c->log->handler = handler;

        ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
        return;
    }

    pscf = ngx_stream_get_module_srv_conf(s, ngx_stream_proxy_module);

    if (from_upstream) {
        src = pc;
        dst = c;
        b = &u->upstream_buf;
        limit_rate = pscf->download_rate;
        received = &u->received;
        out = &u->downstream_out;
        busy = &u->downstream_busy;

    } else {
        src = c;
        dst = pc;
        b = &u->downstream_buf;
        limit_rate = pscf->upload_rate;
        received = &s->received;
        out = &u->upstream_out;
        busy = &u->upstream_busy;
    }

    for ( ;; ) {

        if (do_write && dst) {

            if (*out || *busy || dst->buffered) {
                rc = ngx_stream_top_filter(s, *out, from_upstream);

                if (rc == NGX_ERROR) {
                    if (c->type == SOCK_DGRAM && !from_upstream) {
                        ngx_stream_proxy_next_upstream(s);
                        return;
                    }

                    ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
                    return;
                }

                ngx_chain_update_chains(c->pool, &u->free, busy, out,
                                      (ngx_buf_tag_t) &ngx_stream_proxy_module);

                if (*busy == NULL) {
                    b->pos = b->start;
                    b->last = b->start;
                }
            }
        }

        size = b->end - b->last;

        if (size && src->read->ready && !src->read->delayed
            && !src->read->error)
        {
            if (limit_rate) {
                limit = (off_t) limit_rate * (ngx_time() - u->start_sec + 1)
                        - *received;

                if (limit <= 0) {
                    src->read->delayed = 1;
                    delay = (ngx_msec_t) (- limit * 1000 / limit_rate + 1);
                    ngx_add_timer(src->read, delay);
                    break;
                }

                if ((off_t) size > limit) {
                    size = (size_t) limit;
                }
            }

            n = src->recv(src, b->last, size);

            if (n == NGX_AGAIN) {
                break;
            }

            if (n == NGX_ERROR) {
                if (c->type == SOCK_DGRAM && u->received == 0) {
                    ngx_stream_proxy_next_upstream(s);
                    return;
                }

                src->read->eof = 1;
                n = 0;
            }

            if (n >= 0) {
                if (limit_rate) {
                    delay = (ngx_msec_t) (n * 1000 / limit_rate);

                    if (delay > 0) {
                        src->read->delayed = 1;
                        ngx_add_timer(src->read, delay);
                    }
                }

                if (from_upstream) {
                    if (u->state->first_byte_time == (ngx_msec_t) -1) {
                        u->state->first_byte_time = ngx_current_msec
                                                    - u->state->response_time;
                    }
                }

                if (c->type == SOCK_DGRAM && ++u->responses == pscf->responses)
                {
                    src->read->ready = 0;
                    src->read->eof = 1;
                }

                for (ll = out; *ll; ll = &(*ll)->next) { /* void */ }

                cl = ngx_chain_get_free_buf(c->pool, &u->free);
                if (cl == NULL) {
                    ngx_stream_proxy_finalize(s,
                                              NGX_STREAM_INTERNAL_SERVER_ERROR);
                    return;
                }

                *ll = cl;

                cl->buf->pos = b->last;
                cl->buf->last = b->last + n;
                cl->buf->tag = (ngx_buf_tag_t) &ngx_stream_proxy_module;

                cl->buf->temporary = (n ? 1 : 0);
                cl->buf->last_buf = src->read->eof;
                cl->buf->flush = 1;

                *received += n;
                b->last += n;
                do_write = 1;

                continue;
            }
        }

        break;
    }

    if (src->read->eof && dst && (dst->read->eof || !dst->buffered)) {
        handler = c->log->handler;
        c->log->handler = NULL;

        ngx_log_error(NGX_LOG_INFO, c->log, 0,
                      "%s%s disconnected"
                      ", bytes from/to client:%O/%O"
                      ", bytes from/to upstream:%O/%O",
                      src->type == SOCK_DGRAM ? "udp " : "",
                      from_upstream ? "upstream" : "client",
                      s->received, c->sent, u->received, pc ? pc->sent : 0);

        c->log->handler = handler;

        ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
        return;
    }

    flags = src->read->eof ? NGX_CLOSE_EVENT : 0;

    if (!src->shared && ngx_handle_read_event(src->read, flags) != NGX_OK) {
        ngx_stream_proxy_finalize(s, NGX_STREAM_INTERNAL_SERVER_ERROR);
        return;
    }

    if (dst) {
        if (!dst->shared && ngx_handle_write_event(dst->write, 0) != NGX_OK) {
            ngx_stream_proxy_finalize(s, NGX_STREAM_INTERNAL_SERVER_ERROR);
            return;
        }

        if (!c->read->delayed && !pc->read->delayed) {
            ngx_add_timer(c->write, pscf->timeout);

        } else if (c->write->timer_set) {
            ngx_del_timer(c->write);
        }
    }
}